

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.cpp
# Opt level: O2

void __thiscall de::Process::start(Process *this,char *commandLine,char *workingDirectory)

{
  deBool dVar1;
  ProcessError *this_00;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  dVar1 = deProcess_start(this->m_process,commandLine,workingDirectory);
  if (dVar1 != 0) {
    return;
  }
  this_00 = (ProcessError *)__cxa_allocate_exception(0x10);
  __s = deProcess_getLastError(this->m_process);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  ProcessError::ProcessError(this_00,&local_38);
  __cxa_throw(this_00,&ProcessError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Process::start (const char* commandLine, const char* workingDirectory)
{
	if (!deProcess_start(m_process, commandLine, workingDirectory))
		throw ProcessError(deProcess_getLastError(m_process));
}